

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O2

void Map_TruthsCutOne(Map_Man_t *p,Map_Cut_t *pCut,uint *uTruth)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Map_NodeVec_t *pMVar4;
  Map_Node_t **ppMVar5;
  Map_Node_t *pMVar6;
  Map_Cut_t *pMVar7;
  float fVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  Map_Node_t *pMVar15;
  bool bVar16;
  
  bVar1 = pCut->nLeaves;
  uVar9 = 0;
  if ((char)bVar1 < '\x01') {
    bVar1 = 0;
  }
  pMVar15 = (Map_Node_t *)0x0;
  for (; bVar1 != uVar9; uVar9 = uVar9 + 1) {
    pMVar15 = (Map_Node_t *)pCut->ppLeaves[uVar9]->pCuts;
    *(char *)((long)&pMVar15->p2 + 6) = '\x01';
    *(uint *)((long)&pMVar15->pRepr + 4) = p->uTruths[uVar9][0];
    pMVar15->tRequired[1].Rise = (float)p->uTruths[uVar9][1];
  }
  if (pCut->fMark == '\0') {
    pMVar4 = p->vVisited;
    pMVar4->nSize = 0;
    Map_CutsCollect_rec(pCut,pMVar4);
    pMVar4 = p->vVisited;
    iVar3 = pMVar4->nSize;
    if (0 < (long)iVar3) {
      pCut->nVolume = (char)iVar3;
      bVar2 = pCut->nLeaves;
      uVar9 = 0;
      if ((char)bVar2 < '\x01') {
        bVar2 = 0;
      }
      for (; bVar2 != uVar9; uVar9 = uVar9 + 1) {
        pMVar15 = (Map_Node_t *)pCut->ppLeaves[uVar9]->pCuts;
        *(char *)((long)&pMVar15->p2 + 6) = '\0';
      }
      ppMVar5 = pMVar4->pArray;
      for (lVar10 = 0; iVar3 != lVar10; lVar10 = lVar10 + 1) {
        pMVar15 = ppMVar5[lVar10];
        *(char *)((long)&pMVar15->p2 + 6) = '\0';
        pMVar6 = pMVar15->pNext;
        if (((ulong)pMVar6 & 1) == 0) {
          uVar11 = *(uint *)((long)&pMVar6->pRepr + 4);
          fVar12 = pMVar6->tRequired[1].Rise;
        }
        else {
          uVar11 = ~*(uint *)(((ulong)pMVar6 & 0xfffffffffffffffe) + 0x5c);
          fVar12 = (float)~*(uint *)(((ulong)pMVar6 & 0xfffffffffffffffe) + 0x84);
        }
        pMVar7 = *(Map_Cut_t **)&pMVar15->Num;
        if (((ulong)pMVar7 & 1) == 0) {
          uVar13 = pMVar7->M[0].uPhaseBest;
          uVar14 = pMVar7->M[1].uPhaseBest;
        }
        else {
          uVar13 = ~*(uint *)(((ulong)pMVar7 & 0xfffffffffffffffe) + 0x5c);
          uVar14 = ~*(uint *)(((ulong)pMVar7 & 0xfffffffffffffffe) + 0x84);
        }
        bVar16 = *(char *)((long)&pMVar15->p2 + 7) != '\0';
        fVar8 = (float)~(uVar14 & (uint)fVar12);
        if (!bVar16) {
          fVar8 = (float)(uVar14 & (uint)fVar12);
        }
        *(uint *)((long)&pMVar15->pRepr + 4) = -(uint)bVar16 ^ uVar13 & uVar11;
        pMVar15->tRequired[1].Rise = fVar8;
      }
      *uTruth = *(uint *)((long)&pMVar15->pRepr + 4);
      uTruth[1] = (uint)pMVar15->tRequired[1].Rise;
      return;
    }
    __assert_fail("p->vVisited->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                  ,0xd7,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
  }
  __assert_fail("pCut->fMark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                ,0xd2,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
}

Assistant:

void Map_TruthsCutOne( Map_Man_t * p, Map_Cut_t * pCut, unsigned uTruth[] )
{
    unsigned uTruth1[2], uTruth2[2];
    Map_Cut_t * pTemp = NULL; // Suppress "might be used uninitialized"
    int i;
    // mark the cut leaves
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 1;
        pTemp->M[0].uPhaseBest = p->uTruths[i][0];
        pTemp->M[1].uPhaseBest = p->uTruths[i][1];
    }
    assert( pCut->fMark == 0 );

    // collect the cuts in the cut cone
    p->vVisited->nSize = 0;
    Map_CutsCollect_rec( pCut, p->vVisited );
    assert( p->vVisited->nSize > 0 );
    pCut->nVolume = p->vVisited->nSize;

    // compute the tables and unmark
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 0;
    }
    for ( i = 0; i < p->vVisited->nSize; i++ )
    {
        // get the cut
        pTemp = (Map_Cut_t *)p->vVisited->pArray[i];
        pTemp->fMark = 0;
        // get truth table of the first branch
        if ( Map_CutIsComplement(pTemp->pOne) )
        {
            uTruth1[0] = ~Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = ~Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        else
        {
            uTruth1[0] = Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        // get truth table of the second branch
        if ( Map_CutIsComplement(pTemp->pTwo) )
        {
            uTruth2[0] = ~Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = ~Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        else
        {
            uTruth2[0] = Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        // get the truth table of the output
        if ( !pTemp->Phase )
        {
            pTemp->M[0].uPhaseBest = uTruth1[0] & uTruth2[0];
            pTemp->M[1].uPhaseBest = uTruth1[1] & uTruth2[1];
        }
        else
        {
            pTemp->M[0].uPhaseBest = ~(uTruth1[0] & uTruth2[0]);
            pTemp->M[1].uPhaseBest = ~(uTruth1[1] & uTruth2[1]);
        }
    }
    uTruth[0] = pTemp->M[0].uPhaseBest;
    uTruth[1] = pTemp->M[1].uPhaseBest;
}